

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O2

int scale_expansion(int elen,double *e,double b,double *h)

{
  double dVar1;
  double *pdVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar1 = splitter;
  dVar4 = splitter * b - (splitter * b - b);
  dVar5 = b - dVar4;
  dVar6 = *e;
  dVar8 = splitter * dVar6 - (splitter * dVar6 - dVar6);
  *h = (dVar6 - dVar8) * dVar5 -
       (((dVar6 * b - dVar8 * dVar4) - (dVar6 - dVar8) * dVar4) - dVar8 * dVar5);
  pdVar2 = h + 1;
  dVar6 = dVar6 * b;
  for (lVar3 = 1; lVar3 < elen; lVar3 = lVar3 + 1) {
    dVar8 = e[lVar3];
    dVar7 = dVar8 * b;
    dVar9 = dVar1 * dVar8 - (dVar1 * dVar8 - dVar8);
    dVar9 = (dVar8 - dVar9) * dVar5 -
            (((dVar7 - dVar9 * dVar4) - (dVar8 - dVar9) * dVar4) - dVar9 * dVar5);
    dVar10 = dVar6 + dVar9;
    dVar8 = dVar7 + dVar10;
    *pdVar2 = (dVar6 - (dVar10 - (dVar10 - dVar6))) + (dVar9 - (dVar10 - dVar6));
    pdVar2[1] = (dVar7 - (dVar8 - (dVar8 - dVar7))) + (dVar10 - (dVar8 - dVar7));
    pdVar2 = pdVar2 + 2;
    dVar6 = dVar8;
  }
  *pdVar2 = dVar6;
  return elen * 2;
}

Assistant:

int scale_expansion(int elen, REAL *e, REAL b, REAL *h)
/* e and h cannot be the same. */
{
  INEXACT REAL Q;
  INEXACT REAL sum;
  INEXACT REAL product1;
  REAL product0;
  int eindex, hindex;
  REAL enow;
  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;

  Split(b, bhi, blo);
  Two_Product_Presplit(e[0], b, bhi, blo, Q, h[0]);
  hindex = 1;
  for (eindex = 1; eindex < elen; eindex++) {
    enow = e[eindex];
    Two_Product_Presplit(enow, b, bhi, blo, product1, product0);
    Two_Sum(Q, product0, sum, h[hindex]);
    hindex++;
    Two_Sum(product1, sum, Q, h[hindex]);
    hindex++;
  }
  h[hindex] = Q;
  return elen + elen;
}